

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void * realloc(void *__ptr,size_t __size)

{
  int *piVar1;
  mchunkptr pmVar2;
  void *pvVar3;
  int in_ECX;
  size_t in_RDX;
  size_t extraout_RDX;
  ulong __n;
  bool bVar4;
  
  if (__ptr == (void *)0x0) {
    pvVar3 = malloc(__size);
    return pvVar3;
  }
  if (__size < 0xffffffffffffff80) {
    pmVar2 = (mchunkptr)&DAT_00000020;
    if (0x16 < __size) {
      pmVar2 = (mchunkptr)(__size + 0x17 & 0xfffffffffffffff0);
    }
    if (((byte)_gm_.mflags & 2) != 0) {
      LOCK();
      UNLOCK();
      bVar4 = _gm_.mutex != 0;
      _gm_.mutex = 1;
      if (bVar4) {
        spin_acquire_lock(&_gm_.mutex);
        in_RDX = extraout_RDX;
      }
    }
    pmVar2 = try_realloc_chunk((mstate)((long)__ptr + -0x10),pmVar2,in_RDX,in_ECX);
    if (((byte)_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    if (pmVar2 != (mchunkptr)0x0) {
      return &pmVar2->fd;
    }
    pvVar3 = malloc(__size);
    if (pvVar3 != (void *)0x0) {
      __n = ((ulong)((*(ulong *)((long)__ptr + -8) & 3) != 0) << 3 | 0xfffffffffffffff0) +
            (*(ulong *)((long)__ptr + -8) & 0xfffffffffffffff8);
      if (__size <= __n) {
        __n = __size;
      }
      memcpy(pvVar3,__ptr,__n);
      free(__ptr);
      return pvVar3;
    }
  }
  else {
    piVar1 = _PDCLIB_errno_func();
    *piVar1 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* dlrealloc(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = dlmalloc(bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    dlfree(oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = gm;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = internal_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          internal_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}